

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O3

XMLURL * __thiscall xercesc_4_0::XMLURL::operator=(XMLURL *this,XMLURL *toAssign)

{
  short *psVar1;
  XMLCh *pXVar2;
  Protocols PVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  MemoryManager *pMVar6;
  size_t sVar7;
  XMLCh *pXVar5;
  
  if (this != toAssign) {
    cleanUp(this);
    pMVar6 = toAssign->fMemoryManager;
    this->fMemoryManager = pMVar6;
    pXVar2 = toAssign->fFragment;
    if (pXVar2 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar7 = 0;
      do {
        psVar1 = (short *)((long)pXVar2 + sVar7);
        sVar7 = sVar7 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar7);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar4);
      memcpy(pXVar5,pXVar2,sVar7);
      pMVar6 = this->fMemoryManager;
    }
    this->fFragment = pXVar5;
    pXVar2 = toAssign->fHost;
    if (pXVar2 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar7 = 0;
      do {
        psVar1 = (short *)((long)pXVar2 + sVar7);
        sVar7 = sVar7 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar7);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
      memcpy(pXVar5,pXVar2,sVar7);
      pMVar6 = this->fMemoryManager;
    }
    this->fHost = pXVar5;
    pXVar2 = toAssign->fPassword;
    if (pXVar2 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar7 = 0;
      do {
        psVar1 = (short *)((long)pXVar2 + sVar7);
        sVar7 = sVar7 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar7);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
      memcpy(pXVar5,pXVar2,sVar7);
      pMVar6 = this->fMemoryManager;
    }
    this->fPassword = pXVar5;
    pXVar2 = toAssign->fPath;
    if (pXVar2 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar7 = 0;
      do {
        psVar1 = (short *)((long)pXVar2 + sVar7);
        sVar7 = sVar7 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar7);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
      memcpy(pXVar5,pXVar2,sVar7);
      pMVar6 = this->fMemoryManager;
    }
    this->fPath = pXVar5;
    PVar3 = toAssign->fProtocol;
    this->fPortNum = toAssign->fPortNum;
    this->fProtocol = PVar3;
    pXVar2 = toAssign->fQuery;
    if (pXVar2 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar7 = 0;
      do {
        psVar1 = (short *)((long)pXVar2 + sVar7);
        sVar7 = sVar7 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar7);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_03,iVar4);
      memcpy(pXVar5,pXVar2,sVar7);
      pMVar6 = this->fMemoryManager;
    }
    this->fQuery = pXVar5;
    pXVar2 = toAssign->fUser;
    if (pXVar2 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar7 = 0;
      do {
        psVar1 = (short *)((long)pXVar2 + sVar7);
        sVar7 = sVar7 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar7);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_04,iVar4);
      memcpy(pXVar5,pXVar2,sVar7);
      pMVar6 = this->fMemoryManager;
    }
    this->fUser = pXVar5;
    pXVar2 = toAssign->fURLText;
    if (pXVar2 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar7 = 0;
      do {
        psVar1 = (short *)((long)pXVar2 + sVar7);
        sVar7 = sVar7 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar7);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_05,iVar4);
      memcpy(pXVar5,pXVar2,sVar7);
    }
    this->fURLText = pXVar5;
    this->fHasInvalidChar = toAssign->fHasInvalidChar;
  }
  return this;
}

Assistant:

XMLURL& XMLURL::operator=(const XMLURL& toAssign)
{
    if (this == &toAssign)
        return *this;

    // Clean up our stuff
    cleanUp();

    // And copy his stuff
    fMemoryManager = toAssign.fMemoryManager;
    fFragment = XMLString::replicate(toAssign.fFragment, fMemoryManager);
    fHost = XMLString::replicate(toAssign.fHost, fMemoryManager);
    fPassword = XMLString::replicate(toAssign.fPassword, fMemoryManager);
    fPath = XMLString::replicate(toAssign.fPath, fMemoryManager);
    fPortNum = toAssign.fPortNum;
    fProtocol = toAssign.fProtocol;
    fQuery = XMLString::replicate(toAssign.fQuery, fMemoryManager);
    fUser = XMLString::replicate(toAssign.fUser, fMemoryManager);
    fURLText = XMLString::replicate(toAssign.fURLText, fMemoryManager);
    fHasInvalidChar = toAssign.fHasInvalidChar;

    return *this;
}